

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O0

istream * __thiscall nivalis::Expr::from_bin(Expr *this,istream *is)

{
  size_type sVar1;
  istream *in_RSI;
  vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *in_RDI;
  size_t i;
  ASTNode *in_stack_ffffffffffffffc8;
  istream *in_stack_ffffffffffffffd0;
  istream *is_00;
  undefined8 local_18;
  
  util::
  resize_from_read_bin<std::vector<nivalis::Expr::ASTNode,std::allocator<nivalis::Expr::ASTNode>>>
            (in_stack_ffffffffffffffd0,
             (vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
             in_stack_ffffffffffffffc8);
  local_18 = 0;
  while( true ) {
    sVar1 = std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::size
                      (in_RDI);
    if (sVar1 <= local_18) break;
    is_00 = in_RSI;
    std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::operator[]
              (in_RDI,local_18);
    util::read_bin<nivalis::Expr::ASTNode>(is_00,in_stack_ffffffffffffffc8);
    local_18 = local_18 + 1;
  }
  return in_RSI;
}

Assistant:

std::istream& Expr::from_bin(std::istream& is) {
    util::resize_from_read_bin(is, ast);
    for (size_t i = 0; i < ast.size(); ++i) {
        util::read_bin(is, ast[i]);
    }
    return is;
}